

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O3

int cubeb_stream_init(cubeb *context,cubeb_stream **stream,char *stream_name,
                     cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                     cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                     uint latency,cubeb_data_callback data_callback,
                     cubeb_state_callback state_callback,void *user_ptr)

{
  int extraout_EAX;
  int iVar1;
  cubeb_sample_format cVar2;
  ulong uVar3;
  cubeb_stream_params *pcVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  
  auVar6._0_4_ = -(uint)(context == (cubeb *)0x0);
  auVar6._4_4_ = -(uint)(stream == (cubeb_stream **)0x0);
  auVar6._8_4_ = -(uint)(data_callback == (cubeb_data_callback)0x0);
  auVar6._12_4_ = -(uint)(state_callback == (cubeb_state_callback)0x0);
  iVar1 = movmskps((int)input_stream_params,auVar6);
  if (iVar1 != 0) {
    return -3;
  }
  if (input_stream_params == (cubeb_stream_params *)0x0 &&
      output_stream_params == (cubeb_stream_params *)0x0) {
    cubeb_stream_init_cold_1();
    if (context != (cubeb *)0x0) {
      iVar1 = (**(code **)(context->ops->init + 0x48))();
      return iVar1;
    }
    return extraout_EAX;
  }
  if (output_stream_params != (cubeb_stream_params *)0x0) {
    if (output_stream_params->rate - 0x2ee01 < 0xfffd15e7) {
      return -2;
    }
    if (output_stream_params->channels - 0x100 < 0xffffff01) {
      return -2;
    }
  }
  pcVar4 = output_stream_params;
  if (input_stream_params != (cubeb_stream_params *)0x0) {
    if (input_stream_params->rate - 0x2ee01 < 0xfffd15e7) {
      return -2;
    }
    if (input_stream_params->channels - 0x100 < 0xffffff01) {
      return -2;
    }
    pcVar4 = input_stream_params;
    if (output_stream_params != (cubeb_stream_params *)0x0) {
      if (input_stream_params->rate != output_stream_params->rate) {
        return -2;
      }
      cVar2 = input_stream_params->format;
      if (cVar2 != output_stream_params->format) {
        return -2;
      }
      goto LAB_001094c5;
    }
  }
  cVar2 = pcVar4->format;
LAB_001094c5:
  if (cVar2 < 4) {
    if (95999 < latency - 1) {
      return -3;
    }
    iVar1 = (*context->ops->stream_init)
                      (context,stream,stream_name,input_device,input_stream_params,output_device,
                       output_stream_params,latency,data_callback,state_callback,user_ptr);
    if (iVar1 != -2) {
      return iVar1;
    }
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) &&
       (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
      uVar5 = 0;
      uVar3 = 0;
      if (output_stream_params != (cubeb_stream_params *)0x0) {
        uVar3 = (ulong)(output_stream_params->format != CUBEB_SAMPLE_S16LE);
      }
      if (input_stream_params != (cubeb_stream_params *)0x0) {
        uVar5 = (ulong)(input_stream_params->format != CUBEB_SAMPLE_S16LE);
      }
      (*g_cubeb_log_callback)
                ("%s:%d: Invalid format, %p %p %d %d\n","cubeb.c",0x182,output_stream_params,
                 input_stream_params,uVar3,uVar5);
    }
  }
  return -2;
}

Assistant:

int
cubeb_stream_init(cubeb * context, cubeb_stream ** stream,
                  char const * stream_name, cubeb_devid input_device,
                  cubeb_stream_params * input_stream_params,
                  cubeb_devid output_device,
                  cubeb_stream_params * output_stream_params,
                  unsigned int latency, cubeb_data_callback data_callback,
                  cubeb_state_callback state_callback, void * user_ptr)
{
  int r;

  if (!context || !stream || !data_callback || !state_callback) {
    return CUBEB_ERROR_INVALID_PARAMETER;
  }

  if ((r = validate_stream_params(input_stream_params, output_stream_params)) !=
          CUBEB_OK ||
      (r = validate_latency(latency)) != CUBEB_OK) {
    return r;
  }

  r = context->ops->stream_init(context, stream, stream_name, input_device,
                                input_stream_params, output_device,
                                output_stream_params, latency, data_callback,
                                state_callback, user_ptr);

  if (r == CUBEB_ERROR_INVALID_FORMAT) {
    LOG("Invalid format, %p %p %d %d", output_stream_params,
        input_stream_params,
        output_stream_params && output_stream_params->format,
        input_stream_params && input_stream_params->format);
  }

  return r;
}